

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

uint64_t __thiscall doublechecked::Roaring::andnot_cardinality(Roaring *this,Roaring *r)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint64_t uVar3;
  long lVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int line;
  uint64_t uVar7;
  char *expression;
  unsigned_long result;
  _Rb_tree_header *p_Var8;
  
  uVar3 = roaring_bitmap_andnot_cardinality((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  p_Var5 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    result = (unsigned_long)(uVar3 == 0);
    expression = "ans == 0";
    line = 0x1fc;
  }
  else {
    p_Var6 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(r->check)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 == p_Var8) {
      result = (unsigned_long)
               (uVar3 == (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      expression = "ans == check.size()";
      line = 0x1ff;
    }
    else {
      _Var2 = p_Var5[1]._M_color;
      lVar4 = std::_Rb_tree_decrement(&p_Var8->_M_header);
      if (_Var2 <= *(_Rb_tree_color *)(lVar4 + 0x20)) {
        _Var2 = p_Var6[1]._M_color;
        lVar4 = std::_Rb_tree_decrement(&p_Var1->_M_header);
        if (_Var2 <= *(_Rb_tree_color *)(lVar4 + 0x20)) {
          uVar7 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          do {
            if (p_Var5[1]._M_color == p_Var6[1]._M_color) {
              uVar7 = uVar7 - 1;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
LAB_00106b26:
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            }
            else {
              if (p_Var6[1]._M_color <= p_Var5[1]._M_color) goto LAB_00106b26;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            }
          } while (((_Rb_tree_header *)p_Var5 != p_Var1) && ((_Rb_tree_header *)p_Var6 != p_Var8));
          result = (unsigned_long)(uVar3 == uVar7);
          expression = "ans == count";
          line = 0x211;
          goto LAB_00106b57;
        }
      }
      result = (unsigned_long)
               (uVar3 == (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      expression = "ans == check.size()";
      line = 0x202;
    }
  }
LAB_00106b57:
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return uVar3;
}

Assistant:

uint64_t andnot_cardinality(const Roaring &r) const {
        uint64_t ans = plain.andnot_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            assert_true(ans == 0);
        }  // this empty
        else if (r_it == r_it_end) {
            assert_true(ans == check.size());
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans == check.size());  // disjoint so nothing removed
        } else {                               // may overlap
            uint64_t count = check.size();     // start with cardinality of this
            while (it != it_end && r_it != r_it_end) {
                if (*it == *r_it) {
                    --count;
                    ++it;
                    ++r_it;
                }  // remove overlap
                else if (*it < *r_it) {
                    ++it;
                } else {
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }